

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ImageButton(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
                       int frame_padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImGuiContext_conflict *pIVar1;
  ImVec2 local_5c;
  ImVec2 padding;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec4 *bg_col_local;
  int frame_padding_local;
  ImVec2 *uv1_local;
  ImVec2 *uv0_local;
  ImVec2 *size_local;
  ImTextureID user_texture_id_local;
  
  pIVar1 = GImGui;
  unique0x00012000 = GImGui->CurrentWindow;
  if ((unique0x00012000->SkipItems & 1U) == 0) {
    PushID(user_texture_id);
    padding.x = (float)ImGuiWindow::GetID(stack0xffffffffffffffb0,"#image",(char *)0x0);
    PopID();
    if (frame_padding < 0) {
      local_5c = (pIVar1->Style).FramePadding;
    }
    else {
      ImVec2::ImVec2(&local_5c,(float)frame_padding,(float)frame_padding);
    }
    user_texture_id_local._7_1_ =
         ImageButtonEx((ImGuiID)padding.x,user_texture_id,size,uv0,uv1,&local_5c,bg_col,tint_col);
  }
  else {
    user_texture_id_local._7_1_ = false;
  }
  return user_texture_id_local._7_1_;
}

Assistant:

bool ImGui::ImageButton(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, int frame_padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    // Default to using texture ID as ID. User can still push string/integer prefixes.
    PushID((void*)(intptr_t)user_texture_id);
    const ImGuiID id = window->GetID("#image");
    PopID();

    const ImVec2 padding = (frame_padding >= 0) ? ImVec2((float)frame_padding, (float)frame_padding) : g.Style.FramePadding;
    return ImageButtonEx(id, user_texture_id, size, uv0, uv1, padding, bg_col, tint_col);
}